

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  task_data *__s;
  example *peVar1;
  iterator iVar2;
  iterator this;
  iterator lp;
  undefined8 *in_RDX;
  search *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newtriples;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newpairs;
  char *triple [12];
  char *pair [19];
  size_t i;
  option_group_definition new_options;
  task_data *data;
  vw *all;
  typed_option<bool> *in_stack_fffffffffffff2e8;
  typed_option<bool> *in_stack_fffffffffffff2f0;
  string *in_stack_fffffffffffff2f8;
  typed_option<unsigned_long> *in_stack_fffffffffffff300;
  allocator_type *in_stack_fffffffffffff318;
  char **in_stack_fffffffffffff320;
  char **in_stack_fffffffffffff328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  typed_option<bool> *in_stack_fffffffffffff338;
  option_group_definition *in_stack_fffffffffffff340;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  const_iterator __position;
  __0 local_b99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b58;
  uint32_t in_stack_fffffffffffff4bc;
  search *in_stack_fffffffffffff4c0;
  size_t in_stack_fffffffffffff4d8;
  v_array<unsigned_int> *in_stack_fffffffffffff4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8 [5];
  char local_a01;
  ulong local_a00;
  undefined1 local_9f2;
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [32];
  typed_option<bool> local_9a8 [2];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [32];
  typed_option<bool> local_818 [2];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [32];
  typed_option<bool> local_688 [2];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  typed_option<unsigned_int> local_4f8 [2];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [32];
  typed_option<unsigned_int> local_368 [2];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_long> local_1d8 [2];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  task_data *local_28;
  vw *local_20;
  undefined8 *local_18;
  search *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = Search::search::get_vw_pointer_unsafe(in_RDI);
  __s = (task_data *)operator_new(0x2c8);
  memset(__s,0,0x2c8);
  local_28 = __s;
  v_array<unsigned_int>::resize(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  local_28->ex = (example *)0x0;
  Search::search::set_task_data<task_data>(local_8,local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Dependency Parser Options",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff2f0,
             (string *)in_stack_fffffffffffff2e8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"root_label",&local_1f9);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff2f8,(unsigned_long *)in_stack_fffffffffffff2f0);
  VW::config::typed_option<unsigned_long>::keep(local_1d8,true);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffff300,(unsigned_long)in_stack_fffffffffffff2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,"Ensure that there is only one root in each sentence",&local_221);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff2f0,
             (string *)in_stack_fffffffffffff2e8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff2f0,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff2e8);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff340,(typed_option<unsigned_long> *)in_stack_fffffffffffff338);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"num_label",&local_389);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff2f8,(uint *)in_stack_fffffffffffff2f0)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_368,true);
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff300,
             (uint)((ulong)in_stack_fffffffffffff2f8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"Number of arc labels",&local_3b1);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff2f0,
             (string *)in_stack_fffffffffffff2e8);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff2f0,
             (typed_option<unsigned_int> *)in_stack_fffffffffffff2e8);
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff340,(typed_option<unsigned_int> *)in_stack_fffffffffffff338);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"transition_system",&local_519);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff2f8,(uint *)in_stack_fffffffffffff2f0)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_4f8,true);
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff300,
             (uint)((ulong)in_stack_fffffffffffff2f8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"1: arc-hybrid 2: arc-eager",&local_541);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff2f0,
             (string *)in_stack_fffffffffffff2e8);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff2f0,
             (typed_option<unsigned_int> *)in_stack_fffffffffffff2e8);
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff340,(typed_option<unsigned_int> *)in_stack_fffffffffffff338);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"one_learner",&local_6a9);
  VW::config::make_option<bool>(in_stack_fffffffffffff2f8,(bool *)in_stack_fffffffffffff2f0);
  VW::config::typed_option<bool>::keep(local_688,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6d0,"Using one learner instead of three learners for labeled parser",&local_6d1);
  VW::config::typed_option<bool>::help
            (in_stack_fffffffffffff2f0,(string *)in_stack_fffffffffffff2e8);
  VW::config::typed_option<bool>::typed_option(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"cost_to_go",&local_839);
  VW::config::make_option<bool>(in_stack_fffffffffffff2f8,(bool *)in_stack_fffffffffffff2f0);
  VW::config::typed_option<bool>::keep(local_818,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_860,
             "Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out",
             &local_861);
  VW::config::typed_option<bool>::help
            (in_stack_fffffffffffff2f0,(string *)in_stack_fffffffffffff2e8);
  VW::config::typed_option<bool>::typed_option(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"old_style_labels",&local_9c9);
  VW::config::make_option<bool>(in_stack_fffffffffffff2f8,(bool *)in_stack_fffffffffffff2f0);
  VW::config::typed_option<bool>::keep(local_9a8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"Use old hack of label information",&local_9f1);
  VW::config::typed_option<bool>::help
            (in_stack_fffffffffffff2f0,(string *)in_stack_fffffffffffff2e8);
  VW::config::typed_option<bool>::typed_option(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  (**(code **)*local_18)(local_18,local_60);
  peVar1 = VW::alloc_examples((size_t)in_stack_fffffffffffff2f8,(size_t)in_stack_fffffffffffff2f0);
  local_28->ex = peVar1;
  local_9f2 = 100;
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)in_stack_fffffffffffff2f0,(uchar *)in_stack_fffffffffffff2e8)
  ;
  for (local_a00 = 1; local_a00 < 0xe; local_a00 = local_a00 + 1) {
    local_a01 = (char)local_a00 + 'A';
    v_array<unsigned_char>::push_back
              ((v_array<unsigned_char> *)in_stack_fffffffffffff2f0,
               (uchar *)in_stack_fffffffffffff2e8);
  }
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)in_stack_fffffffffffff2f0,(uchar *)in_stack_fffffffffffff2e8)
  ;
  if ((local_28->one_learner & 1U) == 0) {
    Search::search::set_num_learners(local_8,3);
  }
  else {
    Search::search::set_num_learners(local_8,1);
  }
  memcpy(local_aa8,&PTR_anon_var_dwarf_53a6d6_0047bb40,0x98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x3c5b44);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328,in_stack_fffffffffffff320,
             in_stack_fffffffffffff318);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3c5b6f);
  __first._M_current = local_aa8;
  __position._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xfffffffffffff4bf
  ;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x3c5b8e);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328,in_stack_fffffffffffff320,
             in_stack_fffffffffffff318);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3c5bbc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff300,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff300,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x3c5c08);
  this_00 = &local_20->interactions;
  iVar2 = std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff2e8);
  local_b58 = iVar2._M_current;
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff2f0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff2e8);
  local_b60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff2e8);
  local_b68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff2e8);
  local_b70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        (this_00,__position,__first,iVar2._M_current);
  local_b80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff2e8);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff2f0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff2e8);
  this = std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff2e8);
  local_b88 = this._M_current;
  lp = std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff2e8);
  local_b90 = lp._M_current;
  iVar2 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    (this_00,__position,__first,iVar2._M_current);
  local_b98 = iVar2._M_current;
  if ((local_28->cost_to_go & 1U) == 0) {
    Search::search::set_options(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc);
  }
  else {
    Search::search::set_options(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc);
  }
  initialize(Search::search&,unsigned_long&,VW::config::options_i&)::$_0::
  operator_cast_to_function_pointer(&local_b99);
  Search::search::set_label_parser
            ((search *)this._M_current,(label_parser *)lp._M_current,
             (_func_bool_polylabel_ptr *)iVar2._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this._M_current);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)iVar2._M_current);
  return;
}

Assistant:

void initialize(Search::search &sch, size_t & /*num_actions*/, options_i &options)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = new task_data();
  data->action_loss.resize(5);
  data->ex = NULL;
  sch.set_task_data<task_data>(data);

  option_group_definition new_options("Dependency Parser Options");
  new_options.add(make_option("root_label", data->root_label)
                      .keep()
                      .default_value(8)
                      .help("Ensure that there is only one root in each sentence"));
  new_options.add(make_option("num_label", data->num_label).keep().default_value(12).help("Number of arc labels"));
  new_options.add(make_option("transition_system", data->transition_system)
                      .keep()
                      .default_value(1)
                      .help("1: arc-hybrid 2: arc-eager"));
  new_options.add(make_option("one_learner", data->one_learner)
                      .keep()
                      .help("Using one learner instead of three learners for labeled parser"));
  new_options.add(make_option("cost_to_go", data->cost_to_go)
                      .keep()
                      .help("Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out"));
  new_options.add(
      make_option("old_style_labels", data->old_style_labels).keep().help("Use old hack of label information"));
  options.add_and_parse(new_options);

  data->ex = VW::alloc_examples(sizeof(polylabel), 1);
  data->ex->indices.push_back(val_namespace);
  for (size_t i = 1; i < 14; i++) data->ex->indices.push_back((unsigned char)i + 'A');
  data->ex->indices.push_back(constant_namespace);

  if (data->one_learner)
    sch.set_num_learners(1);
  else
    sch.set_num_learners(3);

  const char *pair[] = {
      "BC", "BE", "BB", "CC", "DD", "EE", "FF", "GG", "EF", "BH", "BJ", "EL", "dB", "dC", "dD", "dE", "dF", "dG", "dd"};
  const char *triple[] = {"EFG", "BEF", "BCE", "BCD", "BEL", "ELM", "BHI", "BCC", "BEJ", "BEH", "BJK", "BEN"};
  vector<string> newpairs(pair, pair + 19);
  vector<string> newtriples(triple, triple + 12);
  all.pairs.swap(newpairs);
  all.triples.swap(newtriples);

  all.interactions.clear();
  all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
  all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
  if (data->cost_to_go)
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING | ACTION_COSTS);
  else
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING);

  sch.set_label_parser(COST_SENSITIVE::cs_label, [](polylabel &l) -> bool { return l.cs.costs.size() == 0; });
}